

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::span<const_char,_18446744073709551615UL>_>_>_>
::get_token_string(string *__return_storage_ptr__,
                  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::span<const_char,_18446744073709551615UL>_>_>_>
                  *this)

{
  bool bVar1;
  byte *pbVar2;
  pointer pvVar3;
  size_type __maxlen;
  undefined1 local_48 [8];
  array<char,_9UL> cs;
  char c;
  const_iterator __end0;
  const_iterator __begin0;
  vector<char,_std::allocator<char>_> *__range3;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::span<const_char,_18446744073709551615UL>_>_>_>
  *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end0 = std::vector<char,_std::allocator<char>_>::begin(&this->token_string);
  register0x00000000 = std::vector<char,_std::allocator<char>_>::end(&this->token_string);
  while (bVar1 = __gnu_cxx::operator==<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                           (&__end0,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                     *)(cs._M_elems + 8)), ((bVar1 ^ 0xffU) & 1) != 0) {
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                     operator*(&__end0);
    cs._M_elems[7] = *pbVar2;
    if ((byte)cs._M_elems[7] < 0x20) {
      cs._M_elems[0] = '\0';
      local_48[0] = '\0';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      pvVar3 = std::array<char,_9UL>::data((array<char,_9UL> *)local_48);
      __maxlen = std::array<char,_9UL>::size((array<char,_9UL> *)local_48);
      snprintf(pvVar3,__maxlen,"<U+%.4X>",(ulong)(byte)cs._M_elems[7]);
      pvVar3 = std::array<char,_9UL>::data((array<char,_9UL> *)local_48);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,pvVar3);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,cs._M_elems[7]);
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_token_string() const
    {
        // escape control characters
        std::string result;
        for (const auto c : token_string)
        {
            if (static_cast<unsigned char>(c) <= '\x1F')
            {
                // escape control characters
                std::array<char, 9> cs{{}};
                (std::snprintf)(cs.data(), cs.size(), "<U+%.4X>", static_cast<unsigned char>(c));
                result += cs.data();
            }
            else
            {
                // add character as is
                result.push_back(static_cast<std::string::value_type>(c));
            }
        }

        return result;
    }